

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

int marktime(int *status)

{
  undefined1 local_30 [8];
  timeval tv;
  time_t temp;
  double telapse;
  int *status_local;
  
  tv.tv_usec = time((time_t *)0x0);
  scpu = clock();
  start = time((time_t *)0x0);
  gettimeofday((timeval *)local_30,(__timezone_ptr_t)0x0);
  startsec = (long)local_30;
  startmilli = (int)(tv.tv_sec / 1000);
  return *status;
}

Assistant:

int marktime( int *status)
{
    double telapse;
    time_t temp;
    struct  timeval tv;

    temp = time(0);

    /* Since elapsed time is only measured to the nearest second */
    /* keep getting the time until the seconds tick just changes. */
    /* This provides more consistent timing measurements since the */
    /* intervals all start on an integer seconds. */

    telapse = 0.;

        scpu = clock();
        start = time(0);
/*
    while (telapse == 0.)
    {
        scpu = clock();
        start = time(0);
        telapse = difftime( start, temp );
    }
*/
        gettimeofday (&tv, NULL);

	startsec = tv.tv_sec;
        startmilli = tv.tv_usec/1000;

    return( *status );
}